

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O0

void __thiscall
wasm::MergeSimilarFunctions::collectEquivalentClasses
          (MergeSimilarFunctions *this,
          vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *classes,
          Module *module)

{
  Function *pFVar1;
  initializer_list<wasm::Function_*> __l;
  initializer_list<wasm::Function_*> __l_00;
  initializer_list<wasm::EquivalentClass> __l_01;
  bool bVar2;
  bool bVar3;
  reference __in;
  size_type sVar4;
  reference ppFVar5;
  ulong uVar6;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>_>
  __result;
  Map *in_RCX;
  anon_class_16_2_f86d9413 visitor;
  EquivalentClass *local_4d0;
  allocator<wasm::Function_*> local_469;
  Function *local_468;
  iterator local_460;
  size_type local_458;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_450;
  EquivalentClass local_438;
  reference local_418;
  EquivalentClass *newClass;
  iterator __end3;
  iterator __begin3;
  vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *__range3;
  value_type pFStack_3f0;
  bool found;
  Function *func;
  Index i;
  iterator local_3d8;
  size_type local_3d0;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_3c8;
  undefined1 *local_3b0;
  EquivalentClass local_3a8;
  iterator local_388;
  size_type local_380;
  undefined1 local_378 [8];
  vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> classesInGroup;
  type *hashGroup;
  type *_;
  _Self local_348;
  iterator __end1;
  iterator __begin1;
  map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  *__range1;
  undefined1 local_320 [8];
  map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  hashGroups;
  FunctionHasher local_2d0;
  anon_class_8_1_a3e7ea9d local_178;
  undefined1 local_170 [8];
  function<bool_(wasm::Expression_*,_unsigned_long_&)> ignoringConsts;
  undefined1 local_140 [8];
  PassRunner runner;
  Map hashes;
  Module *module_local;
  vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *classes_local;
  MergeSimilarFunctions *this_local;
  
  FunctionHasher::createMap((Map *)&runner.isNested,module);
  PassRunner::PassRunner((PassRunner *)local_140,module);
  local_178.ignoringConsts = (function<bool_(wasm::Expression_*,_unsigned_long_&)> *)local_170;
  std::function<bool(wasm::Expression*,unsigned_long&)>::
  function<wasm::MergeSimilarFunctions::collectEquivalentClasses(std::vector<wasm::EquivalentClass,std::allocator<wasm::EquivalentClass>>&,wasm::Module*)::__0,void>
            ((function<bool(wasm::Expression*,unsigned_long&)> *)local_170,&local_178);
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function
            ((function<bool_(wasm::Expression_*,_unsigned_long_&)> *)
             &hashGroups._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (function<bool_(wasm::Expression_*,_unsigned_long_&)> *)local_170);
  FunctionHasher::FunctionHasher
            (&local_2d0,(Map *)&runner.isNested,
             (ExprHasher *)&hashGroups._M_t._M_impl.super__Rb_tree_header._M_node_count);
  WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>::
  run(&local_2d0.
       super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
      ,(PassRunner *)local_140,module);
  FunctionHasher::~FunctionHasher(&local_2d0);
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::~function
            ((function<bool_(wasm::Expression_*,_unsigned_long_&)> *)
             &hashGroups._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ::map((map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
         *)local_320);
  visitor.hashes = in_RCX;
  visitor.hashGroups =
       (map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
        *)&runner.isNested;
  wasm::ModuleUtils::
  iterDefinedFunctions<wasm::MergeSimilarFunctions::collectEquivalentClasses(std::vector<wasm::EquivalentClass,std::allocator<wasm::EquivalentClass>>&,wasm::Module*)::__1>
            ((ModuleUtils *)module,(Module *)local_320,visitor);
  __end1 = std::
           map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
           ::begin((map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                    *)local_320);
  local_348._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
       ::end((map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
              *)local_320);
  do {
    bVar2 = std::operator!=(&__end1,&local_348);
    if (!bVar2) {
      std::
      map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
      ::~map((map<unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
              *)local_320);
      std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::~function
                ((function<bool_(wasm::Expression_*,_unsigned_long_&)> *)local_170);
      PassRunner::~PassRunner((PassRunner *)local_140);
      FunctionHasher::Map::~Map((Map *)&runner.isNested);
      return;
    }
    __in = std::
           _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>
           ::operator*(&__end1);
    std::get<0ul,unsigned_long_const,std::vector<wasm::Function*,std::allocator<wasm::Function*>>>
              (__in);
    classesInGroup.super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  get<1ul,unsigned_long_const,std::vector<wasm::Function*,std::allocator<wasm::Function*>>>
                            (__in);
    sVar4 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size
                      ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                       classesInGroup.
                       super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (1 < sVar4) {
      func._6_1_ = 1;
      local_3b0 = (undefined1 *)&local_3a8;
      ppFVar5 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[]
                          ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                           classesInGroup.
                           super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pFVar1 = *ppFVar5;
      ppFVar5 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[]
                          ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                           classesInGroup.
                           super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      _i = *ppFVar5;
      local_3d8 = (iterator)&i;
      local_3d0 = 1;
      std::allocator<wasm::Function_*>::allocator((allocator<wasm::Function_*> *)((long)&func + 7));
      __l_00._M_len = local_3d0;
      __l_00._M_array = local_3d8;
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                (&local_3c8,__l_00,(allocator<wasm::Function_*> *)((long)&func + 7));
      EquivalentClass::EquivalentClass(&local_3a8,pFVar1,&local_3c8);
      func._6_1_ = 0;
      local_388 = &local_3a8;
      local_380 = 1;
      std::allocator<wasm::EquivalentClass>::allocator
                ((allocator<wasm::EquivalentClass> *)((long)&func + 5));
      __l_01._M_len = local_380;
      __l_01._M_array = local_388;
      std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::vector
                ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)local_378,
                 __l_01,(allocator<wasm::EquivalentClass> *)((long)&func + 5));
      std::allocator<wasm::EquivalentClass>::~allocator
                ((allocator<wasm::EquivalentClass> *)((long)&func + 5));
      local_4d0 = (EquivalentClass *)&local_388;
      do {
        local_4d0 = local_4d0 + -1;
        EquivalentClass::~EquivalentClass(local_4d0);
      } while (local_4d0 != &local_3a8);
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~vector(&local_3c8);
      std::allocator<wasm::Function_*>::~allocator((allocator<wasm::Function_*> *)((long)&func + 7))
      ;
      for (func._0_4_ = 1; uVar6 = (ulong)(uint)func,
          sVar4 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size
                            ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                             classesInGroup.
                             super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar6 < sVar4;
          func._0_4_ = (uint)func + 1) {
        ppFVar5 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[]
                            ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                             classesInGroup.
                             super__Vector_base<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(uint)func);
        pFStack_3f0 = *ppFVar5;
        bVar2 = false;
        __end3 = std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::begin
                           ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *
                            )local_378);
        newClass = (EquivalentClass *)
                   std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::end
                             ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>
                               *)local_378);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<wasm::EquivalentClass_*,_std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>_>
                                           *)&newClass), bVar3) {
          local_418 = __gnu_cxx::
                      __normal_iterator<wasm::EquivalentClass_*,_std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>_>
                      ::operator*(&__end3);
          bVar3 = areInEquvalentClass(this,local_418->primaryFunction,pFStack_3f0,module);
          if (bVar3) {
            std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                      (&local_418->functions,&stack0xfffffffffffffc10);
            bVar2 = true;
            break;
          }
          __gnu_cxx::
          __normal_iterator<wasm::EquivalentClass_*,_std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>_>
          ::operator++(&__end3);
        }
        pFVar1 = pFStack_3f0;
        if (!bVar2) {
          local_468 = pFStack_3f0;
          local_460 = &local_468;
          local_458 = 1;
          std::allocator<wasm::Function_*>::allocator(&local_469);
          __l._M_len = local_458;
          __l._M_array = local_460;
          std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                    (&local_450,__l,&local_469);
          EquivalentClass::EquivalentClass(&local_438,pFVar1,&local_450);
          std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::push_back
                    ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)
                     local_378,&local_438);
          EquivalentClass::~EquivalentClass(&local_438);
          std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~vector(&local_450);
          std::allocator<wasm::Function_*>::~allocator(&local_469);
        }
      }
      __first = std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::begin
                          ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)
                           local_378);
      __last = std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::end
                         ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)
                          local_378);
      __result = std::
                 back_inserter<std::vector<wasm::EquivalentClass,std::allocator<wasm::EquivalentClass>>>
                           (classes);
      std::
      copy<__gnu_cxx::__normal_iterator<wasm::EquivalentClass*,std::vector<wasm::EquivalentClass,std::allocator<wasm::EquivalentClass>>>,std::back_insert_iterator<std::vector<wasm::EquivalentClass,std::allocator<wasm::EquivalentClass>>>>
                ((__normal_iterator<wasm::EquivalentClass_*,_std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>_>
                  )__first._M_current,
                 (__normal_iterator<wasm::EquivalentClass_*,_std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>_>
                  )__last._M_current,__result);
      std::vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_>::~vector
                ((vector<wasm::EquivalentClass,_std::allocator<wasm::EquivalentClass>_> *)local_378)
      ;
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void MergeSimilarFunctions::collectEquivalentClasses(
  std::vector<EquivalentClass>& classes, Module* module) {
  auto hashes = FunctionHasher::createMap(module);
  PassRunner runner(module);

  std::function<bool(Expression*, size_t&)> ignoringConsts =
    [&](Expression* expr, size_t& digest) {
      // Ignore const's immediate operands.
      if (expr->is<Const>()) {
        return true;
      }
      // Ignore callee operands.
      if (auto* call = expr->dynCast<Call>()) {
        for (auto operand : call->operands) {
          rehash(digest,
                 ExpressionAnalyzer::flexibleHash(operand, ignoringConsts));
        }
        rehash(digest, call->isReturn);
        return true;
      }
      return false;
    };
  FunctionHasher(&hashes, ignoringConsts).run(&runner, module);

  // Find hash-equal groups.
  std::map<size_t, std::vector<Function*>> hashGroups;
  ModuleUtils::iterDefinedFunctions(
    *module, [&](Function* func) { hashGroups[hashes[func]].push_back(func); });

  for (auto& [_, hashGroup] : hashGroups) {
    if (hashGroup.size() < 2) {
      continue;
    }

    // Collect exactly equivalent functions ignoring constants.
    std::vector<EquivalentClass> classesInGroup = {
      EquivalentClass(hashGroup[0], {hashGroup[0]})};

    for (Index i = 1; i < hashGroup.size(); i++) {
      auto* func = hashGroup[i];
      bool found = false;
      for (auto& newClass : classesInGroup) {
        if (areInEquvalentClass(newClass.primaryFunction, func, module)) {
          newClass.functions.push_back(func);
          found = true;
          break;
        }
      }

      if (!found) {
        // Same hash but different instruction pattern.
        classesInGroup.push_back(EquivalentClass(func, {func}));
      }
    }
    std::copy(classesInGroup.begin(),
              classesInGroup.end(),
              std::back_inserter(classes));
  }
}